

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

uint32_t asm_callx_flags(ASMState *as,IRIns *ir)

{
  uint uVar1;
  CType *ct;
  CTypeID id;
  IRIns *ira;
  uint32_t nargs;
  IRIns *ir_local;
  ASMState *as_local;
  
  nargs = 0;
  if ((ir->field_0).op1 != 0x7fff) {
    nargs = 1;
    for (ira = as->ir + (ir->field_0).op1; (ira->field_1).o == ']';
        ira = as->ir + (ira->field_0).op1) {
      nargs = nargs + 1;
    }
  }
  if (*(char *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 5) == ']') {
    uVar1 = 0;
    if ((*(uint *)(*(long *)(ulong)as->J[-1].bpropcache[9].mode +
                  (ulong)as->ir[*(ushort *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 2)].
                         field_1.op12 * 0x10) & 0x800000) != 0) {
      uVar1 = 0x800;
    }
    nargs = uVar1 | nargs;
  }
  return nargs | (uint)(ir->field_1).t.irt << 0x10;
}

Assistant:

static uint32_t asm_callx_flags(ASMState *as, IRIns *ir)
{
  uint32_t nargs = 0;
  if (ir->op1 != REF_NIL) {  /* Count number of arguments first. */
    IRIns *ira = IR(ir->op1);
    nargs++;
    while (ira->o == IR_CARG) { nargs++; ira = IR(ira->op1); }
  }
#if LJ_HASFFI
  if (IR(ir->op2)->o == IR_CARG) {  /* Copy calling convention info. */
    CTypeID id = (CTypeID)IR(IR(ir->op2)->op2)->i;
    CType *ct = ctype_get(ctype_ctsG(J2G(as->J)), id);
    nargs |= ((ct->info & CTF_VARARG) ? CCI_VARARG : 0);
#if LJ_TARGET_X86
    nargs |= (ctype_cconv(ct->info) << CCI_CC_SHIFT);
#endif
  }
#endif
  return (nargs | (ir->t.irt << CCI_OTSHIFT));
}